

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsLink.cpp
# Opt level: O0

bool Js::ASMLink::CheckIsBuiltinFunction
               (ScriptContext *scriptContext,Var object,PropertyId propertyId,FunctionInfo *funcInfo
               )

{
  bool bVar1;
  Var aValue;
  JavascriptLibrary *pJVar2;
  JavascriptFunction *pJVar3;
  JavascriptFunction *pJVar4;
  FunctionInfo *this;
  JavascriptMethod p_Var5;
  JavascriptMethod p_Var6;
  bool local_59;
  bool local_49;
  bool local_3d;
  Var mathFuncObj;
  FunctionInfo *funcInfo_local;
  PropertyId propertyId_local;
  Var object_local;
  ScriptContext *scriptContext_local;
  
  aValue = Js::JavascriptOperators::OP_GetProperty(object,propertyId,scriptContext);
  bVar1 = ScriptContext::IsJsBuiltInEnabled(scriptContext);
  if (bVar1) {
    if (propertyId == 0x2a) {
      bVar1 = VarIs<Js::JavascriptFunction>(aValue);
      local_3d = false;
      if (bVar1) {
        pJVar4 = VarTo<Js::JavascriptFunction>(aValue);
        pJVar2 = ScriptContext::GetLibrary(scriptContext);
        pJVar3 = JavascriptLibraryBase::GetMathMinFunction(&pJVar2->super_JavascriptLibraryBase);
        local_3d = pJVar4 == pJVar3;
      }
      return local_3d;
    }
    if (propertyId == 0xfe) {
      bVar1 = VarIs<Js::JavascriptFunction>(aValue);
      local_49 = false;
      if (bVar1) {
        pJVar4 = VarTo<Js::JavascriptFunction>(aValue);
        pJVar2 = ScriptContext::GetLibrary(scriptContext);
        pJVar3 = JavascriptLibraryBase::GetMathMaxFunction(&pJVar2->super_JavascriptLibraryBase);
        local_49 = pJVar4 == pJVar3;
      }
      return local_49;
    }
  }
  bVar1 = VarIs<Js::JavascriptFunction>(aValue);
  local_59 = false;
  if (bVar1) {
    pJVar4 = VarTo<Js::JavascriptFunction>(aValue);
    this = JavascriptFunction::GetFunctionInfo(pJVar4);
    p_Var5 = FunctionInfo::GetOriginalEntryPoint(this);
    p_Var6 = FunctionInfo::GetOriginalEntryPoint(funcInfo);
    local_59 = p_Var5 == p_Var6;
  }
  return local_59;
}

Assistant:

bool ASMLink::CheckIsBuiltinFunction(ScriptContext* scriptContext, const Var object, PropertyId propertyId, const FunctionInfo& funcInfo)
    {
        Var mathFuncObj = JavascriptOperators::OP_GetProperty(object, propertyId, scriptContext);
#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            switch (propertyId)
            {
#define ASMJS_JSBUILTIN_MATH_FUNC_NAMES(propertyId, funcName) case propertyId: \
                return VarIs<JavascriptFunction>(mathFuncObj) && \
                    VarTo<JavascriptFunction>(mathFuncObj) == scriptContext->GetLibrary()->GetMath##funcName##Function();
#include "AsmJsBuiltInNames.h"
            }
        }
#endif
        return VarIs<JavascriptFunction>(mathFuncObj) &&
            VarTo<JavascriptFunction>(mathFuncObj)->GetFunctionInfo()->GetOriginalEntryPoint() == funcInfo.GetOriginalEntryPoint();
    }